

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::HashtableAllTest_Equals_Test
          (HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableAllTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::HashtableAllTest(&this->
                      super_HashtableAllTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    );
  (this->
  super_HashtableAllTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__HashtableTest_00bd4210;
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}